

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxRandom2::FxRandom2(FxRandom2 *this,FRandom *r,FxExpression *m,FScriptPosition *pos,bool nowarn)

{
  FxExpression *pFVar1;
  PType *pPVar2;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_Random2;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxRandom2_0070c520;
  this->EmitTail = false;
  this->rng = r;
  if (m == (FxExpression *)0x0) {
    pFVar1 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&pFVar1->ScriptPosition,pos);
    pFVar1->NeedResult = true;
    pFVar1->ExprType = EFX_Constant;
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
    pPVar2 = (PType *)TypeSInt32;
    pFVar1[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
    pFVar1->ValueType = pPVar2;
    *(undefined4 *)&pFVar1[1].ScriptPosition.FileName.Chars = 0xffffffff;
    pFVar1->isresolved = true;
  }
  else {
    pFVar1 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&pFVar1->ScriptPosition,&m->ScriptPosition);
    pFVar1->isresolved = false;
    pFVar1->NeedResult = true;
    pFVar1->ExprType = EFX_IntCast;
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070b5b0;
    pFVar1[1]._vptr_FxExpression = (_func_int **)m;
    pPVar2 = (PType *)TypeSInt32;
    pFVar1->ValueType = (PType *)TypeSInt32;
    *(bool *)&pFVar1[1].ScriptPosition.FileName.Chars = nowarn;
    *(undefined1 *)((long)&pFVar1[1].ScriptPosition.FileName.Chars + 1) = 0;
  }
  this->mask = pFVar1;
  (this->super_FxExpression).ValueType = pPVar2;
  return;
}

Assistant:

FxRandom2::FxRandom2(FRandom *r, FxExpression *m, const FScriptPosition &pos, bool nowarn)
: FxExpression(EFX_Random2, pos)
{
	EmitTail = false;
	rng = r;
	if (m) mask = new FxIntCast(m, nowarn);
	else mask = new FxConstant(-1, pos);
	ValueType = TypeSInt32;
}